

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# life.h
# Opt level: O2

void __thiscall cell_map::clear_cell(cell_map *this,int x,int y)

{
  int iVar1;
  pointer puVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  
  iVar1 = this->width;
  iVar7 = iVar1 * y;
  puVar2 = (this->cells).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((puVar2[iVar7 + x] & 1) != 0) {
    lVar4 = (long)x + (long)iVar7;
    lVar9 = (long)(int)(-(uint)(x != 0) | iVar1 - 1U);
    iVar8 = this->height + -1;
    iVar10 = iVar8 * iVar1;
    iVar3 = -iVar1;
    if (y == 0) {
      iVar3 = iVar10;
    }
    iVar11 = 1 - iVar1;
    if (iVar1 - 1U != x) {
      iVar11 = 1;
    }
    iVar10 = -iVar10;
    if (iVar8 != y) {
      iVar10 = iVar1;
    }
    puVar2[(long)x + (long)iVar7] = puVar2[(long)x + (long)iVar7] & 0xfe;
    lVar5 = iVar3 + lVar4;
    puVar2[lVar9 + lVar5] = puVar2[lVar9 + lVar5] + 0xfe;
    puVar2[iVar3 + lVar4] = puVar2[iVar3 + lVar4] + 0xfe;
    lVar6 = (long)iVar11;
    puVar2[lVar6 + lVar5] = puVar2[lVar6 + lVar5] + 0xfe;
    puVar2[lVar9 + lVar4] = puVar2[lVar9 + lVar4] + 0xfe;
    puVar2[lVar6 + lVar4] = puVar2[lVar6 + lVar4] + 0xfe;
    lVar5 = iVar10 + lVar4;
    puVar2[lVar9 + lVar5] = puVar2[lVar9 + lVar5] + 0xfe;
    puVar2[iVar10 + lVar4] = puVar2[iVar10 + lVar4] + 0xfe;
    puVar2[lVar6 + lVar5] = puVar2[lVar6 + lVar5] + 0xfe;
    return;
  }
  __assert_fail("cell_state(x, y) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/life/life.h"
                ,0x3d,"void cell_map::clear_cell(int, int)");
}

Assistant:

void clear_cell(int x, int y)
    {
    assert(cell_state(x, y) == 1);

    auto cell_ptr = cells.begin() + (y*width) + x;
    int xoleft, xoright, yoabove, yobelow;

    if (x == 0)
      xoleft = width - 1;
    else
      xoleft = -1;
    if (y == 0)
      yoabove = width * (height - 1);
    else
      yoabove = -width;
    if (x == (width - 1))
      xoright = -(width - 1);
    else
      xoright = 1;
    if (y == (height - 1))
      yobelow = -width * (height - 1);
    else
      yobelow = width;

    *(cell_ptr) &= ~((uint8_t)0x01);
    *(cell_ptr + yoabove + xoleft) -= 2;
    *(cell_ptr + yoabove) -= 2;
    *(cell_ptr + yoabove + xoright) -= 2;
    *(cell_ptr + xoleft) -= 2;
    *(cell_ptr + xoright) -= 2;
    *(cell_ptr + yobelow + xoleft) -= 2;
    *(cell_ptr + yobelow) -= 2;
    *(cell_ptr + yobelow + xoright) -= 2;
    }